

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O1

void __thiscall
flatbuffers::dart::DartGenerator::DartGenerator
          (DartGenerator *this,Parser *parser,string *path,string *file_name)

{
  DartGenerator *pDVar1;
  long *plVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Config result;
  allocator_type local_b4a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_b49;
  DartGenerator *local_b48;
  string local_b40;
  string local_b20;
  string local_b00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ae0;
  Config local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  undefined4 *local_940;
  undefined8 local_938;
  undefined4 local_930;
  undefined1 local_92c;
  undefined4 *local_920;
  undefined8 local_918;
  undefined4 local_910;
  undefined2 local_90c;
  undefined1 local_90a;
  undefined4 *local_900;
  undefined8 local_8f8;
  undefined4 local_8f0;
  undefined1 local_8ec;
  undefined2 *local_8e0;
  undefined8 local_8d8;
  undefined2 local_8d0;
  undefined1 local_8ce;
  undefined4 *local_8c0;
  undefined8 local_8b8;
  undefined4 local_8b0;
  undefined1 local_8ac;
  undefined2 *local_8a0;
  undefined8 local_898;
  undefined2 local_890;
  undefined1 local_88e;
  undefined4 *local_880;
  undefined8 local_878;
  undefined4 local_870;
  undefined2 local_86c;
  undefined1 local_86a;
  undefined4 *local_860;
  undefined8 local_858;
  undefined4 local_850;
  undefined2 local_84c;
  undefined1 local_84a;
  undefined4 *local_840;
  undefined8 local_838;
  undefined4 local_830;
  undefined2 local_82c;
  undefined1 local_82a;
  undefined8 *local_820;
  undefined8 local_818;
  undefined8 local_810;
  undefined1 local_808;
  undefined1 local_807;
  undefined4 *local_800;
  undefined8 local_7f8;
  undefined4 local_7f0;
  undefined1 local_7ec;
  undefined1 local_7eb;
  undefined4 *local_7e0;
  undefined8 local_7d8;
  undefined4 local_7d0;
  undefined1 local_7cc;
  undefined1 local_7cb;
  undefined4 *local_7c0;
  undefined8 local_7b8;
  undefined4 local_7b0;
  undefined3 uStack_7ac;
  undefined1 local_7a9;
  undefined2 *local_7a0;
  undefined8 local_798;
  undefined2 local_790;
  undefined1 local_78e;
  undefined4 *local_780;
  undefined8 local_778;
  undefined4 local_770;
  undefined2 local_76c;
  undefined1 local_76a;
  undefined4 *local_760;
  undefined8 local_758;
  undefined4 local_750;
  undefined1 local_74c;
  undefined1 local_74b;
  undefined8 *local_740;
  undefined8 local_738;
  undefined8 local_730;
  undefined1 local_728;
  undefined1 local_727;
  undefined4 *local_720;
  undefined8 local_718;
  undefined4 local_710;
  undefined1 local_70c;
  undefined4 *local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  undefined1 local_6ec;
  undefined4 *local_6e0;
  undefined8 local_6d8;
  undefined4 local_6d0;
  undefined1 local_6cc;
  undefined1 local_6cb;
  undefined8 *local_6c0;
  undefined8 local_6b8;
  undefined8 local_6b0;
  undefined1 local_6a8;
  undefined4 *local_6a0;
  undefined8 local_698;
  undefined4 local_690;
  undefined3 uStack_68c;
  undefined1 local_689;
  undefined4 *local_680;
  undefined8 local_678;
  undefined4 local_670;
  undefined1 local_66c;
  undefined4 *local_660;
  undefined8 local_658;
  undefined4 local_650;
  undefined1 local_64c;
  undefined4 *local_640;
  undefined8 local_638;
  undefined4 local_630;
  undefined3 uStack_62c;
  undefined1 local_629;
  undefined4 *local_620;
  undefined8 local_618;
  undefined4 local_610;
  undefined1 local_60c;
  undefined1 local_60b;
  undefined4 *local_600;
  undefined8 local_5f8;
  undefined4 local_5f0;
  undefined1 local_5ec;
  undefined1 local_5eb;
  undefined4 *local_5e0;
  undefined8 local_5d8;
  undefined4 local_5d0;
  undefined1 local_5cc;
  undefined1 local_5cb;
  undefined4 *local_5c0;
  undefined8 local_5b8;
  undefined4 local_5b0;
  undefined1 local_5ac;
  undefined1 local_5ab;
  undefined2 *local_5a0;
  undefined8 local_598;
  undefined2 local_590;
  undefined1 local_58e;
  undefined1 local_58d;
  undefined4 *local_580;
  undefined8 local_578;
  undefined4 local_570;
  undefined1 local_56c;
  undefined4 *local_560;
  undefined8 local_558;
  undefined4 local_550;
  undefined1 local_54c;
  undefined1 local_54b;
  undefined4 *local_540;
  undefined8 local_538;
  undefined4 local_530;
  undefined1 local_52c;
  undefined1 local_52b;
  undefined4 *local_520;
  undefined8 local_518;
  undefined4 local_510;
  undefined1 local_50c;
  undefined2 *local_500;
  undefined8 local_4f8;
  undefined2 local_4f0;
  undefined1 local_4ee;
  undefined1 local_4ed;
  undefined4 *local_4e0;
  undefined8 local_4d8;
  undefined4 local_4d0;
  undefined1 local_4cc;
  undefined1 local_4cb;
  undefined4 *local_4c0;
  undefined8 local_4b8;
  undefined4 local_4b0;
  undefined3 uStack_4ac;
  undefined1 local_4a9;
  undefined2 *local_4a0;
  undefined8 local_498;
  undefined2 local_490;
  undefined1 local_48e;
  undefined4 *local_480;
  undefined8 local_478;
  undefined4 local_470;
  undefined3 uStack_46c;
  undefined1 local_469;
  undefined8 *local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined1 local_448;
  undefined2 *local_440;
  undefined8 local_438;
  undefined2 local_430;
  undefined1 local_42e;
  undefined1 local_42d;
  undefined8 *local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined2 *local_400;
  undefined8 local_3f8;
  undefined2 local_3f0;
  undefined1 local_3ee;
  undefined1 local_3ed;
  undefined8 *local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8;
  undefined1 local_3c7;
  undefined8 *local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined1 local_3a8;
  undefined4 *local_3a0;
  undefined8 local_398;
  undefined4 local_390;
  undefined1 local_38c;
  undefined4 *local_380;
  undefined8 local_378;
  undefined4 local_370;
  undefined1 local_36c;
  undefined4 *local_360;
  undefined8 local_358;
  undefined4 local_350;
  undefined3 uStack_34c;
  undefined1 local_349;
  undefined2 *local_340;
  undefined8 local_338;
  undefined2 local_330;
  undefined1 local_32e;
  undefined1 local_32d;
  undefined8 *local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined1 local_308;
  undefined4 *local_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined1 local_2ec;
  undefined1 local_2eb;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c8;
  undefined4 *local_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0;
  undefined1 local_2ac;
  undefined4 *local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  undefined3 uStack_28c;
  undefined1 local_289;
  undefined4 *local_280;
  undefined8 local_278;
  undefined4 local_270;
  undefined1 local_26c;
  undefined2 *local_260;
  undefined8 local_258;
  undefined2 local_250;
  undefined1 local_24e;
  undefined2 *local_240;
  undefined8 local_238;
  undefined2 local_230;
  undefined1 local_22e;
  undefined4 *local_220;
  undefined8 local_218;
  undefined4 local_210;
  undefined2 local_20c;
  undefined1 local_20a;
  undefined4 *local_200;
  undefined8 local_1f8;
  undefined4 local_1f0;
  undefined1 local_1ec;
  undefined1 local_1eb;
  undefined4 *local_1e0;
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined3 uStack_1cc;
  undefined1 local_1c9;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined2 local_1a8;
  undefined1 local_1a6;
  long *local_1a0 [2];
  undefined8 local_190;
  undefined1 local_180 [136];
  string local_f8 [104];
  string local_90 [32];
  string local_70 [64];
  
  local_b40._M_dataplus._M_p = (pointer)&local_b40.field_2;
  local_b48 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b40,"");
  local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b20,".","");
  local_b00._M_dataplus._M_p = (pointer)&local_b00.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b00,"dart","");
  pDVar1 = local_b48;
  BaseGenerator::BaseGenerator
            (&local_b48->super_BaseGenerator,parser,path,file_name,&local_b40,&local_b20,&local_b00)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b00._M_dataplus._M_p != &local_b00.field_2) {
    operator_delete(local_b00._M_dataplus._M_p,local_b00.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
    operator_delete(local_b20._M_dataplus._M_p,local_b20.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b40._M_dataplus._M_p != &local_b40.field_2) {
    operator_delete(local_b40._M_dataplus._M_p,local_b40.field_2._M_allocated_capacity + 1);
  }
  (pDVar1->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_003f2bc8;
  local_ab0.enum_variant_seperator._M_dataplus._M_p =
       (pointer)&local_ab0.enum_variant_seperator.field_2;
  local_ab0.types = kUpperCamel;
  local_ab0.constants = kScreamingSnake;
  local_ab0.methods = kLowerCamel;
  local_ab0.functions = kUnknown;
  local_ab0.fields = kLowerCamel;
  local_ab0.variables = kLowerCamel;
  local_ab0.variants = kKeep;
  local_ab0.enum_variant_seperator.field_2._M_allocated_capacity._0_2_ = 0x2e;
  local_ab0.enum_variant_seperator._M_string_length = 1;
  local_ab0.escape_keywords = AfterConvertingCase;
  local_ab0.namespaces = kSnake2;
  local_ab0.namespace_seperator._M_dataplus._M_p = (pointer)&local_ab0.namespace_seperator.field_2;
  local_ab0.namespace_seperator.field_2._M_allocated_capacity._0_2_ = 0x2e;
  local_ab0.namespace_seperator._M_string_length = 1;
  local_ab0.object_prefix._M_dataplus._M_p = (pointer)&local_ab0.object_prefix.field_2;
  local_ab0.object_prefix._M_string_length = 0;
  local_ab0.object_prefix.field_2._M_local_buf[0] = '\0';
  local_ab0.object_suffix._M_dataplus._M_p = (pointer)&local_ab0.object_suffix.field_2;
  local_ab0.object_suffix.field_2._M_allocated_capacity._0_2_ = 0x54;
  local_ab0.object_suffix._M_string_length = 1;
  local_ab0.keyword_prefix._M_dataplus._M_p = (pointer)&local_ab0.keyword_prefix.field_2;
  local_ab0.keyword_prefix.field_2._M_local_buf[0] = '$';
  local_ab0.keyword_prefix._M_string_length = 1;
  local_ab0.keyword_prefix.field_2._M_local_buf[1] = '\0';
  local_ab0.keyword_suffix._M_dataplus._M_p = (pointer)&local_ab0.keyword_suffix.field_2;
  local_ab0.keyword_suffix._M_string_length = 0;
  local_ab0.keyword_suffix.field_2._M_local_buf[0] = '\0';
  local_ab0.filenames = kKeep;
  local_ab0.directories = kKeep;
  local_ab0.output_path._M_dataplus._M_p = (pointer)&local_ab0.output_path.field_2;
  local_ab0.output_path._M_string_length = 0;
  local_ab0.output_path.field_2._M_local_buf[0] = '\0';
  local_ab0.filename_suffix._M_dataplus._M_p = (pointer)&local_ab0.filename_suffix.field_2;
  local_ab0.filename_suffix.field_2._M_allocated_capacity = 0x746172656e65675f;
  local_ab0.filename_suffix.field_2._8_2_ = 0x6465;
  local_ab0.filename_suffix._M_string_length = 10;
  local_ab0.filename_suffix.field_2._M_local_buf[10] = '\0';
  local_ab0.filename_extension._M_dataplus._M_p = (pointer)&local_ab0.filename_extension.field_2;
  local_ab0.filename_extension.field_2._M_allocated_capacity._0_4_ = 0x7261642e;
  local_ab0.filename_extension.field_2._M_allocated_capacity._4_2_ = 0x74;
  local_ab0.filename_extension._M_string_length = 5;
  Namer::Config::Config((Config *)local_180,&local_ab0);
  std::__cxx11::string::_M_assign((string *)(local_180 + 0x68));
  std::__cxx11::string::_M_assign(local_f8);
  std::__cxx11::string::_M_assign(local_90);
  std::__cxx11::string::_M_assign(local_70);
  local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
  local_960.field_2._M_allocated_capacity = 0x7463617274736261;
  local_960._M_string_length = 8;
  local_960.field_2._M_local_buf[8] = '\0';
  local_940 = &local_930;
  local_930 = 0x65736c65;
  local_938 = 4;
  local_92c = 0;
  local_920 = &local_910;
  local_90c = 0x7472;
  local_910 = 0x6f706d69;
  local_918 = 6;
  local_90a = 0;
  local_900 = &local_8f0;
  local_8f0 = 0x776f6873;
  local_8f8 = 4;
  local_8ec = 0;
  local_8e0 = &local_8d0;
  local_8d0 = 0x7361;
  local_8d8 = 2;
  local_8ce = 0;
  local_8c0 = &local_8b0;
  local_8b0 = 0x6d756e65;
  local_8b8 = 4;
  local_8ac = 0;
  local_8a0 = &local_890;
  local_890 = 0x6e69;
  local_898 = 2;
  local_88e = 0;
  local_880 = &local_870;
  local_870 = 0x74617473;
  local_86c = 0x6369;
  local_878 = 6;
  local_86a = 0;
  local_860 = &local_850;
  local_84c = 0x7472;
  local_850 = 0x65737361;
  local_858 = 6;
  local_84a = 0;
  local_840 = &local_830;
  local_82c = 0x7472;
  local_830 = 0x6f707865;
  local_838 = 6;
  local_82a = 0;
  local_820 = &local_810;
  local_808 = 0x65;
  local_810 = 0x6361667265746e69;
  local_818 = 9;
  local_807 = 0;
  local_800 = &local_7f0;
  local_7ec = 0x72;
  local_7f0 = 0x65707573;
  local_7f8 = 5;
  local_7eb = 0;
  local_7e0 = &local_7d0;
  local_7cc = 99;
  local_7d0 = 0x6e797361;
  local_7d8 = 5;
  local_7cb = 0;
  local_7c0 = &local_7b0;
  uStack_7ac = 0x73646e;
  local_7b0 = 0x65747865;
  local_7b8 = 7;
  local_7a9 = 0;
  local_7a0 = &local_790;
  local_790 = 0x7369;
  local_798 = 2;
  local_78e = 0;
  local_780 = &local_770;
  local_76c = 0x6863;
  local_770 = 0x74697773;
  local_778 = 6;
  local_76a = 0;
  local_760 = &local_750;
  local_74c = 0x74;
  local_750 = 0x69617761;
  local_758 = 5;
  local_74b = 0;
  local_740 = &local_730;
  local_728 = 0x6e;
  local_730 = 0x6f69736e65747865;
  local_738 = 9;
  local_727 = 0;
  local_720 = &local_710;
  local_710 = 0x6574616c;
  local_718 = 4;
  local_70c = 0;
  local_700 = &local_6f0;
  local_6f0 = 0x636e7973;
  local_6f8 = 4;
  local_6ec = 0;
  local_6e0 = &local_6d0;
  local_6cc = 0x6b;
  local_6d0 = 0x61657262;
  local_6d8 = 5;
  local_6cb = 0;
  local_6c0 = &local_6b0;
  local_6b0 = 0x6c616e7265747865;
  local_6b8 = 8;
  local_6a8 = 0;
  local_6a0 = &local_690;
  uStack_68c = 0x797261;
  local_690 = 0x7262696c;
  local_698 = 7;
  local_689 = 0;
  local_680 = &local_670;
  local_670 = 0x73696874;
  local_678 = 4;
  local_66c = 0;
  local_660 = &local_650;
  local_650 = 0x65736163;
  local_658 = 4;
  local_64c = 0;
  local_640 = &local_630;
  uStack_62c = 0x79726f;
  local_630 = 0x74636166;
  local_638 = 7;
  local_629 = 0;
  local_620 = &local_610;
  local_60c = 0x6e;
  local_610 = 0x6978696d;
  local_618 = 5;
  local_60b = 0;
  local_600 = &local_5f0;
  local_5ec = 0x77;
  local_5f0 = 0x6f726874;
  local_5f8 = 5;
  local_5eb = 0;
  local_5e0 = &local_5d0;
  local_5cc = 0x68;
  local_5d0 = 0x63746163;
  local_5d8 = 5;
  local_5cb = 0;
  local_5c0 = &local_5b0;
  local_5ac = 0x65;
  local_5b0 = 0x736c6166;
  local_5b8 = 5;
  local_5ab = 0;
  local_5a0 = &local_590;
  local_58e = 0x77;
  local_590 = 0x656e;
  local_598 = 3;
  local_58d = 0;
  local_580 = &local_570;
  local_570 = 0x65757274;
  local_578 = 4;
  local_56c = 0;
  local_560 = &local_550;
  local_54c = 0x73;
  local_550 = 0x73616c63;
  local_558 = 5;
  local_54b = 0;
  local_540 = &local_530;
  local_530 = 0x616e6966;
  local_52c = 0x6c;
  local_538 = 5;
  local_52b = 0;
  local_520 = &local_510;
  local_510 = 0x6c6c756e;
  local_518 = 4;
  local_50c = 0;
  local_500 = &local_4f0;
  local_4ee = 0x79;
  local_4f0 = 0x7274;
  local_4f8 = 3;
  local_4ed = 0;
  local_4e0 = &local_4d0;
  local_4cc = 0x74;
  local_4d0 = 0x736e6f63;
  local_4d8 = 5;
  local_4cb = 0;
  local_4c0 = &local_4b0;
  local_4b0 = 0x616e6966;
  uStack_4ac = 0x796c6c;
  local_4b8 = 7;
  local_4a9 = 0;
  local_4a0 = &local_490;
  local_490 = 0x6e6f;
  local_498 = 2;
  local_48e = 0;
  local_480 = &local_470;
  uStack_46c = 0x666564;
  local_470 = 0x65707974;
  local_478 = 7;
  local_469 = 0;
  local_460 = &local_450;
  local_450 = 0x65756e69746e6f63;
  local_458 = 8;
  local_448 = 0;
  local_440 = &local_430;
  local_42e = 0x72;
  local_430 = 0x6f66;
  local_438 = 3;
  local_42d = 0;
  local_420 = &local_410;
  local_410 = 0x726f74617265706f;
  local_418 = 8;
  local_408 = 0;
  local_400 = &local_3f0;
  local_3ee = 0x72;
  local_3f0 = 0x6176;
  local_3f8 = 3;
  local_3ed = 0;
  local_3e0 = &local_3d0;
  local_3c8 = 0x74;
  local_3d0 = 0x6e61697261766f63;
  local_3d8 = 9;
  local_3c7 = 0;
  local_3c0 = &local_3b0;
  local_3b0 = 0x6e6f6974636e7546;
  local_3b8 = 8;
  local_3a8 = 0;
  local_3a0 = &local_390;
  local_390 = 0x74726170;
  local_398 = 4;
  local_38c = 0;
  local_380 = &local_370;
  local_370 = 0x64696f76;
  local_378 = 4;
  local_36c = 0;
  local_360 = &local_350;
  uStack_34c = 0x746c75;
  local_350 = 0x61666564;
  local_358 = 7;
  local_349 = 0;
  local_340 = &local_330;
  local_32e = 0x74;
  local_330 = 0x6567;
  local_338 = 3;
  local_32d = 0;
  local_320 = &local_310;
  local_310 = 0x6465726975716572;
  local_318 = 8;
  local_308 = 0;
  local_300 = &local_2f0;
  local_2ec = 0x65;
  local_2f0 = 0x6c696877;
  local_2f8 = 5;
  local_2eb = 0;
  local_2e0 = &local_2d0;
  local_2d0 = 0x6465727265666564;
  local_2d8 = 8;
  local_2c8 = 0;
  local_2c0 = &local_2b0;
  local_2b0 = 0x65646968;
  local_2b8 = 4;
  local_2ac = 0;
  local_2a0 = &local_290;
  uStack_28c = 0x776f72;
  local_290 = 0x68746572;
  local_298 = 7;
  local_289 = 0;
  local_280 = &local_270;
  local_270 = 0x68746977;
  local_278 = 4;
  local_26c = 0;
  local_260 = &local_250;
  local_250 = 0x6f64;
  local_258 = 2;
  local_24e = 0;
  local_240 = &local_230;
  local_230 = 0x6669;
  local_238 = 2;
  local_22e = 0;
  local_220 = &local_210;
  local_20c = 0x6e72;
  local_210 = 0x75746572;
  local_218 = 6;
  local_20a = 0;
  local_200 = &local_1f0;
  local_1ec = 100;
  local_1f0 = 0x6c656979;
  local_1f8 = 5;
  local_1eb = 0;
  local_1e0 = &local_1d0;
  uStack_1cc = 0x63696d;
  local_1d0 = 0x616e7964;
  local_1d8 = 7;
  local_1c9 = 0;
  local_1c0 = &local_1b0;
  local_1b0 = 0x6e656d656c706d69;
  local_1a8 = 0x7374;
  local_1b8 = 10;
  local_1a6 = 0;
  plVar2 = &local_190;
  local_190._2_1_ = 0x74;
  local_190._0_2_ = 0x6573;
  local_1a0[1] = (long *)0x3;
  local_190._3_1_ = 0;
  __l._M_len = 0x3f;
  __l._M_array = &local_960;
  local_1a0[0] = plVar2;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_ae0,__l,&local_b49,&local_b4a);
  lVar3 = -0x7e0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  IdlNamer::IdlNamer(&pDVar1->namer_,(Config *)local_180,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_ae0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_ae0);
  Namer::Config::~Config((Config *)local_180);
  Namer::Config::~Config(&local_ab0);
  return;
}

Assistant:

DartGenerator(const Parser &parser, const std::string &path,
                const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", ".", "dart"),
        namer_(WithFlagOptions(DartDefaultConfig(), parser.opts, path),
               DartKeywords()) {}